

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

void Saig_ManWindowInsertBig_rec
               (Aig_Man_t *pNew,Aig_Obj_t *pObjBig,Vec_Ptr_t *vBigNode2SmallPo,
               Vec_Ptr_t *vSmallPi2BigNode)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Obj_t *p1;
  
  if ((pObjBig->field_5).pData == (void *)0x0) {
    iVar1 = pObjBig->Id;
    if (((long)iVar1 < 0) || (vBigNode2SmallPo->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar2 = vBigNode2SmallPo->pArray[iVar1];
    if (pvVar2 == (void *)0x0) {
      if ((*(uint *)&pObjBig->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObjBig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x130,
                      "void Saig_ManWindowInsertBig_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      Saig_ManWindowInsertBig_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjBig->pFanin0 & 0xfffffffffffffffe),vBigNode2SmallPo,
                 vSmallPi2BigNode);
      Saig_ManWindowInsertBig_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjBig->pFanin1 & 0xfffffffffffffffe),vBigNode2SmallPo,
                 vSmallPi2BigNode);
      if (((ulong)pObjBig & 1) != 0) goto LAB_006f2e1d;
      uVar4 = (ulong)pObjBig->pFanin0 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObjBig->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      uVar4 = (ulong)pObjBig->pFanin1 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObjBig->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
      pAVar3 = Aig_And(pNew,pAVar3,p1);
    }
    else {
      Saig_ManWindowInsertSmall_rec
                (pNew,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),
                 vBigNode2SmallPo,vSmallPi2BigNode);
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006f2e1d:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar4 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
      }
    }
    (pObjBig->field_5).pData = pAVar3;
  }
  return;
}

Assistant:

void Saig_ManWindowInsertBig_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjBig, 
         Vec_Ptr_t * vBigNode2SmallPo, Vec_Ptr_t * vSmallPi2BigNode )
{
    Aig_Obj_t * pMatch;
    if ( pObjBig->pData )
        return;
    if ( (pMatch = (Aig_Obj_t *)Vec_PtrEntry( vBigNode2SmallPo, pObjBig->Id )) )
    {
        Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin0(pMatch), vBigNode2SmallPo, vSmallPi2BigNode );
        pObjBig->pData = Aig_ObjChild0Copy(pMatch);
        return;        
    }
    assert( Aig_ObjIsNode(pObjBig) );
    Saig_ManWindowInsertBig_rec( pNew, Aig_ObjFanin0(pObjBig), vBigNode2SmallPo, vSmallPi2BigNode );
    Saig_ManWindowInsertBig_rec( pNew, Aig_ObjFanin1(pObjBig), vBigNode2SmallPo, vSmallPi2BigNode );
    pObjBig->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObjBig), Aig_ObjChild1Copy(pObjBig) );
}